

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O2

int loadScript(char *filePath,long uline,void *thunk,
              _func_int_char_ptr_long_int_ptr_void_ptr *evalFunc)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  __ino_t _Var4;
  int iVar5;
  uint ch;
  uint ch_00;
  int ch_01;
  uint uVar6;
  FILE *__stream;
  void *__s;
  ushort **ppuVar7;
  size_t i;
  __ino_t _Var8;
  int level;
  uint uVar9;
  int iVar10;
  bool bVar11;
  int local_e4;
  int isBreak;
  void *local_d8;
  _func_int_char_ptr_long_int_ptr_void_ptr *local_d0;
  long local_c8;
  stat buf;
  
  local_d8 = thunk;
  local_d0 = evalFunc;
  iVar5 = stat(filePath,(stat *)&buf);
  if (((iVar5 == 0) && ((buf.st_mode & 0xf000) == 0x4000)) ||
     (__stream = fopen(filePath,"r"), __stream == (FILE *)0x0)) {
    return 0;
  }
  __s = malloc(0x1000);
  buf.st_nlink = 0x1000;
  local_e4 = 1;
  buf.st_dev = (__dev_t)__s;
LAB_00103241:
  do {
    iVar5 = feof(__stream);
    if (iVar5 != 0) {
LAB_00103451:
      free(__s);
      fclose(__stream);
      return local_e4;
    }
    memset(__s,0,buf.st_nlink);
    buf.st_ino = 0;
    local_c8 = uline;
    uVar9 = 0;
    bVar2 = false;
LAB_00103279:
    do {
      ch = fgetc(__stream);
    } while (ch == 0xd);
    if (ch != 0xffffffff) {
      uline = uline + (ulong)(ch == 10);
      SimpleBuffer_putc((SimpleBuffer *)&buf,ch);
      if (ch == 0x2a && uVar9 == 0x2f) {
        iVar5 = 1;
        iVar10 = 0;
        do {
          do {
            ch_01 = fgetc(__stream);
          } while (ch_01 == 0xd);
          if (ch_01 == -1) break;
          if (ch_01 == 10) {
            uline = uline + 1;
          }
          SimpleBuffer_putc((SimpleBuffer *)&buf,ch_01);
          iVar5 = (iVar5 - (uint)(ch_01 == 0x2f && iVar10 == 0x2a)) +
                  (uint)(ch_01 == 0x2a && iVar10 == 0x2f);
          iVar10 = ch_01;
        } while (iVar5 != 0);
        uVar9 = 0x2f;
      }
      else if ((ch - 0x22 < 0x3f) &&
              (uVar6 = ch, (0x4000000000000021U >> ((ulong)(ch - 0x22) & 0x3f) & 1) != 0)) {
        do {
          do {
            ch_00 = fgetc(__stream);
          } while (ch_00 == 0xd);
          if (ch_00 == 0xffffffff) break;
          if (ch_00 == 10) {
            uline = uline + 1;
          }
          SimpleBuffer_putc((SimpleBuffer *)&buf,ch_00);
          bVar11 = uVar6 == 0x5c;
          uVar6 = ch_00;
        } while (bVar11 || ch_00 != ch);
      }
      else {
        uVar6 = uVar9 ^ 10;
        if ((ch == 10 && uVar6 == 0) && !bVar2) goto LAB_001033c8;
        if (uVar9 == 0x7b) {
          bVar2 = true;
        }
        uVar9 = ch;
        if (uVar6 == 0 && ch == 0x7d) {
          bVar2 = false;
        }
      }
      goto LAB_00103279;
    }
LAB_001033c8:
    __s = (void *)buf.st_dev;
    lVar3 = local_c8;
    if (((2 < buf.st_ino && (int)local_c8 == 1) && (*(char *)buf.st_dev == '#')) &&
       (*(char *)(buf.st_dev + 1) == '!')) {
      buf.st_ino = 0;
    }
    _Var4 = buf.st_ino;
    _Var8 = 0;
    do {
      if (_Var4 == _Var8) goto LAB_00103241;
      ppuVar7 = __ctype_b_loc();
      pcVar1 = (char *)((long)__s + _Var8);
      _Var8 = _Var8 + 1;
    } while ((*(byte *)((long)*ppuVar7 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
    isBreak = 0;
    local_e4 = (*local_d0)((char *)__s,lVar3,&isBreak,local_d8);
    if ((local_e4 == 0) || (isBreak != 0)) goto LAB_00103451;
  } while( true );
}

Assistant:

static int loadScript(const char *filePath, long uline, void *thunk, int (*evalFunc)(const char*, long, int *, void *))
{
	int isSuccessfullyLoading = false;
	if(isDir(filePath)) {
		return isSuccessfullyLoading;
	}
	FILE *fp = fopen(filePath, "r");
	if(fp != NULL) {
		SimpleBuffer simpleBuffer;
		simpleBuffer.buffer = (char *)malloc(K_PAGESIZE);
		simpleBuffer.allocSize = K_PAGESIZE;
		isSuccessfullyLoading = true;
		while(!feof(fp)) {
			kfileline_t rangeheadline = uline;
			khalfword_t sline = (khalfword_t)uline;
			bzero(simpleBuffer.buffer, simpleBuffer.allocSize);
			simpleBuffer.size = 0;
			uline = readChunk(fp, uline, &simpleBuffer);
			const char *script = (const char *)simpleBuffer.buffer;
			if(sline == 1 && simpleBuffer.size > 2 && script[0] == '#' && script[1] == '!') {
				// fall through this line
				simpleBuffer.size = 0;
				//TODO: do we increment uline??
			}
			if(!isEmptyChunk(script, simpleBuffer.size)) {
				int isBreak = false;
				isSuccessfullyLoading = evalFunc(script, rangeheadline, &isBreak, thunk);
				if(!isSuccessfullyLoading|| isBreak) {
					break;
				}
			}
		}
		free(simpleBuffer.buffer);
		fclose(fp);
	}
	return isSuccessfullyLoading;
}